

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  int32_t c;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 != 0) {
    c = getSingleCP(s);
    if (-1 < c) {
      UVar2 = contains(this,c);
      return UVar2;
    }
    UVar2 = UVector::contains(this->strings,s);
    return UVar2;
  }
  return '\0';
}

Assistant:

UBool UnicodeSet::contains(const UnicodeString& s) const {
    if (s.length() == 0) return FALSE;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        return strings->contains((void*) &s);
    } else {
        return contains((UChar32) cp);
    }
}